

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableOpenContextMenu(int column_n)

{
  ImGuiTable *pIVar1;
  ImU32 id;
  int iVar2;
  
  pIVar1 = GImGui->CurrentTable;
  if (column_n == -1) {
    column_n = pIVar1->CurrentColumn;
  }
  iVar2 = -1;
  if (column_n != pIVar1->ColumnsCount) {
    iVar2 = column_n;
  }
  if ((-2 < iVar2) && (iVar2 < pIVar1->ColumnsCount)) {
    if ((pIVar1->Flags & 7) != 0) {
      pIVar1->IsContextPopupOpen = true;
      pIVar1->ContextPopupColumn = (ImS8)iVar2;
      pIVar1->InstanceInteracted = pIVar1->InstanceCurrent;
      id = ImHashStr("##ContextMenu",0,pIVar1->ID);
      OpenPopupEx(id,0);
      return;
    }
    return;
  }
  __assert_fail("column_n >= -1 && column_n < table->ColumnsCount",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                ,0x299a,"void ImGui::TableOpenContextMenu(int)");
}

Assistant:

void    ImGui::TableOpenContextMenu(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (column_n == -1 && table->CurrentColumn != -1)   // When called within a column automatically use this one (for consistency)
        column_n = table->CurrentColumn;
    if (column_n == table->ColumnsCount)                // To facilitate using with TableGetHoveredColumn()
        column_n = -1;
    IM_ASSERT(column_n >= -1 && column_n < table->ColumnsCount);
    if (table->Flags & (ImGuiTableFlags_Resizable | ImGuiTableFlags_Reorderable | ImGuiTableFlags_Hideable))
    {
        table->IsContextPopupOpen = true;
        table->ContextPopupColumn = (ImS8)column_n;
        table->InstanceInteracted = table->InstanceCurrent;
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        OpenPopupEx(context_menu_id, ImGuiPopupFlags_None);
    }
}